

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void test_qclab_qgates_QGate1<float>(void)

{
  allocator<float> *paVar1;
  undefined1 *this;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  initializer_list<float> __l_12;
  initializer_list<float> __l_13;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_10c0;
  AssertHelper local_10a0;
  Message local_1098;
  SquareMatrix<float> local_1090;
  SquareMatrix<float> local_1080;
  bool local_1069;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar__31;
  SquareMatrix<float> mat3_3;
  AssertHelper local_1028;
  Message local_1020;
  SquareMatrix<float> local_1018;
  bool local_1001;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_fd0;
  Message local_fc8;
  SquareMatrix<float> local_fc0;
  bool local_fa9;
  undefined1 local_fa8 [8];
  AssertionResult gtest_ar__29;
  SquareMatrix<float> mat2_3;
  AssertHelper local_f68;
  Message local_f60;
  bool local_f51;
  undefined1 local_f50 [8];
  AssertionResult gtest_ar__28;
  M check1_5;
  string local_f20;
  AssertHelper local_f00;
  Message local_ef8;
  bool local_ee9;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar__27;
  SquareMatrix<float> mat1_3;
  undefined1 local_eb8 [8];
  M Ytrans_1;
  RotationY<float> Y_2;
  AssertHelper local_e70;
  Message local_e68;
  SquareMatrix<float> local_e60;
  SquareMatrix<float> local_e50;
  bool local_e39;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<float> mat3_2;
  AssertHelper local_df8;
  Message local_df0;
  SquareMatrix<float> local_de8;
  bool local_dd1;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_da0;
  Message local_d98;
  SquareMatrix<float> local_d90;
  bool local_d79;
  undefined1 local_d78 [8];
  AssertionResult gtest_ar__24;
  SquareMatrix<float> mat2_2;
  AssertHelper local_d38;
  Message local_d30;
  bool local_d21;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar__23;
  M check1_4;
  string local_cf0;
  AssertHelper local_cd0;
  Message local_cc8;
  bool local_cb9;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar__22;
  SquareMatrix<float> mat1_2;
  undefined1 local_c88 [8];
  M Ytrans;
  RotationY<float> Y_1;
  AssertHelper local_c40;
  Message local_c38;
  SquareMatrix<float> local_c30;
  SquareMatrix<float> local_c20;
  SquareMatrix<float> local_c10;
  bool local_bf9;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<float> mat3_1;
  AssertHelper local_bb8;
  Message local_bb0;
  SquareMatrix<float> local_ba8;
  SquareMatrix<float> local_b98;
  bool local_b81;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_b50;
  Message local_b48;
  SquareMatrix<float> local_b40;
  SquareMatrix<float> local_b30;
  bool local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<float> mat2_1;
  AssertHelper local_ad8;
  Message local_ad0;
  bool local_ac1;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar__18;
  M check1_3;
  string local_a90;
  AssertHelper local_a70;
  Message local_a68;
  SquareMatrix<float> local_a60;
  bool local_a49;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar__17;
  SquareMatrix<float> mat1_1;
  PauliX<float> X_2;
  AssertHelper local_9f8;
  Message local_9f0;
  SquareMatrix<float> local_9e8;
  SquareMatrix<float> local_9d8;
  SquareMatrix<float> local_9c8;
  bool local_9b1;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<float> mat3;
  AssertHelper local_970;
  Message local_968;
  SquareMatrix<float> local_960;
  SquareMatrix<float> local_950;
  bool local_939;
  undefined1 local_938 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_908;
  Message local_900;
  SquareMatrix<float> local_8f8;
  SquareMatrix<float> local_8e8;
  bool local_8d1;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar__14;
  SquareMatrix<float> mat2;
  AssertHelper local_890;
  Message local_888;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__13;
  M check1_2;
  string local_848;
  AssertHelper local_828;
  Message local_820;
  SquareMatrix<float> local_818;
  bool local_801;
  undefined1 local_800 [8];
  AssertionResult gtest_ar__12;
  SquareMatrix<float> mat1;
  PauliX<float> X_1;
  AssertHelper local_7b0;
  Message local_7a8;
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__11;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__10;
  string local_6d8;
  AssertHelper local_6b8;
  Message local_6b0;
  bool local_6a1;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar__9;
  float local_688 [8];
  iterator local_668;
  size_type local_660;
  undefined1 local_658 [8];
  V check3_1;
  V vec3_1;
  AssertHelper local_608;
  Message local_600;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__8;
  string local_5c0;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__7;
  float local_570 [4];
  iterator local_560;
  size_type local_558;
  undefined1 local_550 [8];
  V check2_1;
  V vec2_1;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__6;
  float local_4d0 [2];
  iterator local_4c8;
  size_type local_4c0;
  undefined1 local_4b8 [8];
  V check1_1;
  V vec1_1;
  RotationY<float> Y;
  AssertHelper local_450;
  Message local_448;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__5;
  string local_3f0;
  AssertHelper local_3d0;
  Message local_3c8;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__4;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__3;
  float local_328 [10];
  iterator local_300;
  size_type local_2f8;
  undefined1 local_2f0 [8];
  V check3;
  V vec3;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__2;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__1;
  float local_208 [4];
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e8 [8];
  V check2;
  V vec2;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  float local_168 [2];
  iterator local_160;
  size_type local_158;
  undefined1 local_150 [8];
  V check1;
  V vec1;
  PauliX<float> X;
  float local_108 [8];
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  V v3;
  float local_b8 [4];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  V v2;
  float local_78 [2];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  V v1;
  SquareMatrix<float> I3;
  undefined1 local_28 [8];
  SquareMatrix<float> I2;
  SquareMatrix<float> I1;
  
  qclab::dense::eye<float>((dense *)&I2.data_,2);
  qclab::dense::eye<float>((dense *)local_28,4);
  qclab::dense::eye<float>
            ((dense *)&v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,8);
  local_78[0] = 3.0;
  local_78[1] = 5.0;
  local_70 = local_78;
  local_68 = 2;
  paVar1 = (allocator<float> *)
           ((long)&v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_13._M_len = local_68;
  __l_13._M_array = local_70;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_60,__l_13,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_b8[0] = 3.0;
  local_b8[1] = 5.0;
  local_b8[2] = 2.0;
  local_b8[3] = 7.0;
  local_a8 = local_b8;
  local_a0 = 4;
  paVar1 = (allocator<float> *)
           ((long)&v3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_12._M_len = local_a0;
  __l_12._M_array = local_a8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_98,__l_12,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&v3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_108[4] = 4.0;
  local_108[5] = 1.0;
  local_108[6] = 8.0;
  local_108[7] = 3.0;
  local_108[0] = 3.0;
  local_108[1] = 5.0;
  local_108[2] = 2.0;
  local_108[3] = 7.0;
  local_e8 = local_108;
  local_e0 = 8;
  this = &X.super_QGate1<float>.field_0xf;
  std::allocator<float>::allocator((allocator<float> *)this);
  __l_11._M_len = local_e0;
  __l_11._M_array = local_e8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_d8,__l_11,(allocator_type *)this);
  std::allocator<float>::~allocator((allocator<float> *)&X.super_QGate1<float>.field_0xf);
  qclab::qgates::PauliX<float>::PauliX
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,0);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_60);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,1,
             (vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_168[0] = 5.0;
  local_168[1] = 3.0;
  local_160 = local_168;
  local_158 = 2;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_10._M_len = local_158;
  __l_10._M_array = local_160;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_150,__l_10,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_181 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_180,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string
              ((string *)
               &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_98);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_208[0] = 2.0;
  local_208[1] = 7.0;
  local_208[2] = 3.0;
  local_208[3] = 5.0;
  local_1f8 = local_208;
  local_1f0 = 4;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_09._M_len = local_1f0;
  __l_09._M_array = local_1f8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1e8,__l_09,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_221 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,1);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_98);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x40a00000;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x40400000;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&gtest_ar__2.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_1e8,__l_08);
  local_289 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_1e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_288,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_328[4] = 8.0;
  local_328[5] = 3.0;
  local_328[6] = 4.0;
  local_328[7] = 1.0;
  local_328[0] = 2.0;
  local_328[1] = 7.0;
  local_328[2] = 3.0;
  local_328[3] = 5.0;
  local_300 = local_328;
  local_2f8 = 8;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_07._M_len = local_2f8;
  __l_07._M_array = local_300;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2f0,__l_07,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_341 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_2f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_340,&local_341,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_340,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,0);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f80000040800000;
  __l_06._M_len = 8;
  __l_06._M_array = (iterator)&gtest_ar__4.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_2f0,__l_06);
  local_3b9 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_2f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar2) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f0,(internal *)local_3b8,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,2);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4040000040a00000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&gtest_ar__5.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_2f0,__l_05);
  local_439 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_2f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar2) {
    testing::Message::Message(&local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y.super_QRotationGate1<float>.rotation_,(internal *)local_438,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    std::__cxx11::string::~string((string *)&Y.super_QRotationGate1<float>.rotation_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2f0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_1e8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_150);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<float>::~PauliX
            ((PauliX<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  qclab::qgates::RotationY<float>::RotationY
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,0.0,1.0,false);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_60);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<float,_std::allocator<float>_> *)
             &check1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_4d0[0] = 5.0;
  local_4d0[1] = -3.0;
  local_4c8 = local_4d0;
  local_4c0 = 2;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__6.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_04._M_len = local_4c0;
  __l_04._M_array = local_4c8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_4b8,__l_04,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_4e9 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_4b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar2) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_4e8,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string
              ((string *)
               &vec2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_98);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_570[0] = 2.0;
  local_570[1] = 7.0;
  local_570[2] = -3.0;
  local_570[3] = -5.0;
  local_560 = local_570;
  local_558 = 4;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_03._M_len = local_558;
  __l_03._M_array = local_560;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_550,__l_03,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_589 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_550);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5c0,(internal *)local_588,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_98);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x40a00000;
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0xc0400000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&gtest_ar__8.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_550,__l_02);
  local_5f1 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_550);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar2) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_5f0,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string
              ((string *)
               &vec3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_688[4] = 8.0;
  local_688[5] = 3.0;
  local_688[6] = -4.0;
  local_688[7] = -1.0;
  local_688[0] = 2.0;
  local_688[1] = 7.0;
  local_688[2] = -3.0;
  local_688[3] = -5.0;
  local_668 = local_688;
  local_660 = 8;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_01._M_len = local_660;
  __l_01._M_array = local_668;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_658,__l_01,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_6a1 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_658);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a0,&local_6a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar2) {
    testing::Message::Message(&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6d8,(internal *)local_6a0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    std::__cxx11::string::~string((string *)&local_6d8);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f80000040800000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&gtest_ar__10.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_658,__l_00);
  local_719 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_658);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar2) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_750,(internal *)local_718,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  qclab::qgates::QGate1<float>::setQubit
            ((QGate1<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_d8);
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc040000040a00000;
  __l._M_len = 8;
  __l._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_658,__l);
  local_799 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_658);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar2) {
    testing::Message::Message(&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_1.super_QGate1<float>.qubit_,(internal *)local_798,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    std::__cxx11::string::~string((string *)&X_1.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_658);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_550);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check2_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_4b8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<float>::~RotationY
            ((RotationY<float> *)
             &vec1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&mat1.data_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__12.message_,(SquareMatrix<float> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<float> *)&gtest_ar__12.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_818);
  local_801 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__12.message_,&local_818);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_800,&local_801,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_818);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar2) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_848,(internal *)local_800,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&local_848);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check1_2.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__12.message_,(SquareMatrix<float> *)&check1_2.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check1_2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<float> *)&gtest_ar__12.message_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__13.message_,3.0,2.0,7.0,5.0);
  local_879 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__12.message_,
                         (SquareMatrix<float> *)&gtest_ar__13.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_878,&local_879,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar2) {
    testing::Message::Message(&local_888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2.data_,(internal *)local_878,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    std::__cxx11::string::~string((string *)&mat2.data_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__14.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<float> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_8f8);
  qclab::dense::kron<float>((dense *)&local_8e8,&local_8f8,(SquareMatrix<float> *)&I2.data_);
  local_8d1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__14.message_,&local_8e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d0,&local_8d1,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_8e8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_8f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar2) {
    testing::Message::Message(&local_900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_8d0,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_908,&local_900);
    testing::internal::AssertHelper::~AssertHelper(&local_908);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  qclab::qgates::QGate1<float>::setQubit((QGate1<float> *)&mat1.data_,1);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__14.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<float> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_960);
  qclab::dense::kron<float>((dense *)&local_950,(SquareMatrix<float> *)&I2.data_,&local_960);
  local_939 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__14.message_,&local_950);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_938,&local_939,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_950);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_960);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar2) {
    testing::Message::Message(&local_968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_938,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__16.message_,
             (SquareMatrix<float> *)
             &v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1.data_,Left,NoTrans,3,
             (SquareMatrix<float> *)&gtest_ar__16.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_9e8);
  qclab::dense::kron<float>((dense *)&local_9d8,&local_9e8,(SquareMatrix<float> *)&I2.data_);
  qclab::dense::kron<float>((dense *)&local_9c8,(SquareMatrix<float> *)&I2.data_,&local_9d8);
  local_9b1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__16.message_,&local_9c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9b0,&local_9b1,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_9c8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_9d8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_9e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar2) {
    testing::Message::Message(&local_9f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_2.super_QGate1<float>.qubit_,(internal *)local_9b0,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    std::__cxx11::string::~string((string *)&X_2.super_QGate1<float>.qubit_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__16.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__14.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__13.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__12.message_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&mat1.data_);
  qclab::qgates::PauliX<float>::PauliX((PauliX<float> *)&mat1_1.data_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__17.message_,(SquareMatrix<float> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<float> *)&gtest_ar__17.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_a60);
  local_a49 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__17.message_,&local_a60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a48,&local_a49,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_a60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar2) {
    testing::Message::Message(&local_a68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a90,(internal *)local_a48,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a70,&local_a68);
    testing::internal::AssertHelper::~AssertHelper(&local_a70);
    std::__cxx11::string::~string((string *)&local_a90);
    testing::Message::~Message(&local_a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check1_3.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__17.message_,(SquareMatrix<float> *)&check1_3.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check1_3.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<float> *)&gtest_ar__17.message_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__18.message_,5.0,7.0,2.0,3.0);
  local_ac1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__17.message_,
                         (SquareMatrix<float> *)&gtest_ar__18.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ac0,&local_ac1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar2) {
    testing::Message::Message(&local_ad0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_1.data_,(internal *)local_ac0,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ad8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ad8,&local_ad0);
    testing::internal::AssertHelper::~AssertHelper(&local_ad8);
    std::__cxx11::string::~string((string *)&mat2_1.data_);
    testing::Message::~Message(&local_ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__19.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<float> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_b40);
  qclab::dense::kron<float>((dense *)&local_b30,&local_b40,(SquareMatrix<float> *)&I2.data_);
  local_b19 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__19.message_,&local_b30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b18,&local_b19,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_b30);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_b40);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar2) {
    testing::Message::Message(&local_b48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_b18,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b50,&local_b48);
    testing::internal::AssertHelper::~AssertHelper(&local_b50);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  qclab::qgates::QGate1<float>::setQubit((QGate1<float> *)&mat1_1.data_,1);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__19.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<float> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_ba8);
  qclab::dense::kron<float>((dense *)&local_b98,(SquareMatrix<float> *)&I2.data_,&local_ba8);
  local_b81 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__19.message_,&local_b98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b80,&local_b81,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_b98);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_ba8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
  if (!bVar2) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_1.data_,(internal *)local_b80,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&mat3_1.data_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__21.message_,
             (SquareMatrix<float> *)
             &v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<float>::apply
            ((PauliX<float> *)&mat1_1.data_,Right,NoTrans,3,
             (SquareMatrix<float> *)&gtest_ar__21.message_,0);
  qclab::qgates::PauliX<float>::matrix((PauliX<float> *)&local_c30);
  qclab::dense::kron<float>((dense *)&local_c20,&local_c30,(SquareMatrix<float> *)&I2.data_);
  qclab::dense::kron<float>((dense *)&local_c10,(SquareMatrix<float> *)&I2.data_,&local_c20);
  local_bf9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__21.message_,&local_c10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bf8,&local_bf9,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_c10);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_c20);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_c30);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
  if (!bVar2) {
    testing::Message::Message(&local_c38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1.super_QRotationGate1<float>.rotation_,(internal *)local_bf8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c40,&local_c38);
    testing::internal::AssertHelper::~AssertHelper(&local_c40);
    std::__cxx11::string::~string((string *)&Y_1.super_QRotationGate1<float>.rotation_);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__18.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__17.message_);
  qclab::qgates::PauliX<float>::~PauliX((PauliX<float> *)&mat1_1.data_);
  qclab::qgates::RotationY<float>::RotationY((RotationY<float> *)&Ytrans.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<float>::matrix((RotationY<float> *)&mat1_2.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<float>>
            ((dense *)local_c88,(SquareMatrix<float> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__22.message_,(SquareMatrix<float> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<float> *)&gtest_ar__22.message_,0);
  local_cb9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__22.message_,
                         (SquareMatrix<float> *)local_c88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cb8,&local_cb9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar2) {
    testing::Message::Message(&local_cc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cf0,(internal *)local_cb8,(AssertionResult *)"mat1 == Ytrans","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_cd0,&local_cc8);
    testing::internal::AssertHelper::~AssertHelper(&local_cd0);
    std::__cxx11::string::~string((string *)&local_cf0);
    testing::Message::~Message(&local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check1_4.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__22.message_,(SquareMatrix<float> *)&check1_4.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check1_4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<float> *)&gtest_ar__22.message_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__23.message_,-3.0,2.0,-7.0,5.0);
  local_d21 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__22.message_,
                         (SquareMatrix<float> *)&gtest_ar__23.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d20,&local_d21,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar2) {
    testing::Message::Message(&local_d30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_2.data_,(internal *)local_d20,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d38,&local_d30);
    testing::internal::AssertHelper::~AssertHelper(&local_d38);
    std::__cxx11::string::~string((string *)&mat2_2.data_);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__24.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<float> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_d90,(SquareMatrix<float> *)local_c88,(SquareMatrix<float> *)&I2.data_);
  local_d79 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__24.message_,&local_d90);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d78,&local_d79,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_d90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar2) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_d78,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  qclab::qgates::QGate1<float>::setQubit((QGate1<float> *)&Ytrans.data_,1);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__24.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<float> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_de8,(SquareMatrix<float> *)&I2.data_,(SquareMatrix<float> *)local_c88);
  local_dd1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__24.message_,&local_de8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd0,&local_dd1,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_de8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar2) {
    testing::Message::Message(&local_df0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_2.data_,(internal *)local_dd0,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,pcVar3);
    testing::internal::AssertHelper::operator=(&local_df8,&local_df0);
    testing::internal::AssertHelper::~AssertHelper(&local_df8);
    std::__cxx11::string::~string((string *)&mat3_2.data_);
    testing::Message::~Message(&local_df0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__26.message_,
             (SquareMatrix<float> *)
             &v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans.data_,Left,Trans,3,
             (SquareMatrix<float> *)&gtest_ar__26.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_e60,(SquareMatrix<float> *)local_c88,(SquareMatrix<float> *)&I2.data_);
  qclab::dense::kron<float>((dense *)&local_e50,(SquareMatrix<float> *)&I2.data_,&local_e60);
  local_e39 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__26.message_,&local_e50);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e38,&local_e39,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_e50);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_e60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
  if (!bVar2) {
    testing::Message::Message(&local_e68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_2.super_QRotationGate1<float>.rotation_,(internal *)local_e38,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e70,&local_e68);
    testing::internal::AssertHelper::~AssertHelper(&local_e70);
    std::__cxx11::string::~string((string *)&Y_2.super_QRotationGate1<float>.rotation_);
    testing::Message::~Message(&local_e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__24.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__23.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__22.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_c88);
  qclab::qgates::RotationY<float>::~RotationY((RotationY<float> *)&Ytrans.data_);
  qclab::qgates::RotationY<float>::RotationY((RotationY<float> *)&Ytrans_1.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<float>::matrix((RotationY<float> *)&mat1_3.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<float>>
            ((dense *)local_eb8,(SquareMatrix<float> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__27.message_,(SquareMatrix<float> *)&I2.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<float> *)&gtest_ar__27.message_,0);
  local_ee9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__27.message_,
                         (SquareMatrix<float> *)local_eb8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ee8,&local_ee9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee8);
  if (!bVar2) {
    testing::Message::Message(&local_ef8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f20,(internal *)local_ee8,(AssertionResult *)"mat1 == Ytrans","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f00,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_f00);
    std::__cxx11::string::~string((string *)&local_f20);
    testing::Message::~Message(&local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee8);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check1_5.data_,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__27.message_,(SquareMatrix<float> *)&check1_5.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check1_5.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<float> *)&gtest_ar__27.message_,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__28.message_,5.0,7.0,-2.0,-3.0);
  local_f51 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__27.message_,
                         (SquareMatrix<float> *)&gtest_ar__28.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f50,&local_f51,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
  if (!bVar2) {
    testing::Message::Message(&local_f60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_3.data_,(internal *)local_f50,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f68,&local_f60);
    testing::internal::AssertHelper::~AssertHelper(&local_f68);
    std::__cxx11::string::~string((string *)&mat2_3.data_);
    testing::Message::~Message(&local_f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__29.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<float> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_fc0,(SquareMatrix<float> *)local_eb8,(SquareMatrix<float> *)&I2.data_);
  local_fa9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__29.message_,&local_fc0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fa8,&local_fa9,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_fc0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa8);
  if (!bVar2) {
    testing::Message::Message(&local_fc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_fa8,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fd0,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_fd0);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_fc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa8);
  qclab::qgates::QGate1<float>::setQubit((QGate1<float> *)&Ytrans_1.data_,1);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__29.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<float> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_1018,(SquareMatrix<float> *)&I2.data_,(SquareMatrix<float> *)local_eb8)
  ;
  local_1001 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__29.message_,&local_1018);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1000,&local_1001,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1018);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
  if (!bVar2) {
    testing::Message::Message(&local_1020);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_3.data_,(internal *)local_1000,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1028,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1028,&local_1020);
    testing::internal::AssertHelper::~AssertHelper(&local_1028);
    std::__cxx11::string::~string((string *)&mat3_3.data_);
    testing::Message::~Message(&local_1020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__31.message_,
             (SquareMatrix<float> *)
             &v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<float>::apply
            ((RotationY<float> *)&Ytrans_1.data_,Right,Trans,3,
             (SquareMatrix<float> *)&gtest_ar__31.message_,0);
  qclab::dense::kron<float>
            ((dense *)&local_1090,(SquareMatrix<float> *)local_eb8,(SquareMatrix<float> *)&I2.data_)
  ;
  qclab::dense::kron<float>((dense *)&local_1080,(SquareMatrix<float> *)&I2.data_,&local_1090);
  local_1069 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__31.message_,&local_1080);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1068,&local_1069,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1080);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1090);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1068);
  if (!bVar2) {
    testing::Message::Message(&local_1098);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10c0,(internal *)local_1068,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10a0,&local_1098);
    testing::internal::AssertHelper::~AssertHelper(&local_10a0);
    std::__cxx11::string::~string((string *)&local_10c0);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1068);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__31.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__29.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__28.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__27.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_eb8);
  qclab::qgates::RotationY<float>::~RotationY((RotationY<float> *)&Ytrans_1.data_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_d8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_98);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  qclab::dense::SquareMatrix<float>::~SquareMatrix
            ((SquareMatrix<float> *)
             &v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_28);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}